

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_oct(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  code *pcVar2;
  ulong uVar3;
  error_flags eVar4;
  char *s_;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t len_;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  basic_substring<const_char> bVar12;
  basic_substring<const_char> local_30;
  
  uVar7 = this->len;
  if (pos < uVar7) {
    s_ = this->str;
    bVar1 = s_[pos];
    bVar8 = bVar1 & 0xf8;
    len_ = pos;
    if (bVar8 == 0x30) {
      do {
        if (uVar7 - 1 == len_) {
          if (uVar7 <= pos) goto LAB_001954c5;
          s_ = this->str;
          goto LAB_001954ca;
        }
        bVar1 = s_[len_ + 1];
        len_ = len_ + 1;
      } while ((bVar1 & 0xf8) == 0x30);
    }
    if (bVar1 == 0x2e) {
      uVar6 = len_ + 1;
      if (uVar7 <= uVar6) {
LAB_001954d5:
        uVar5 = 0;
        if (uVar6 < uVar7) {
          uVar5 = uVar7;
        }
        if (bVar8 != 0x30) {
          uVar7 = uVar5;
        }
        goto LAB_001954ca;
      }
      bVar1 = s_[uVar6];
      bVar9 = bVar1 & 0xf8;
      bVar11 = bVar9 == 0x30;
      uVar5 = uVar6;
      if (bVar11) {
        uVar3 = len_ + 2;
        do {
          uVar5 = uVar3;
          if (uVar7 <= uVar5) goto LAB_001954d5;
          bVar1 = s_[uVar5];
          uVar3 = uVar5 + 1;
        } while ((bVar1 & 0xf8) == 0x30);
      }
      uVar10 = (uint)bVar1;
      if ((bVar1 & 0xdf) == 0x50) goto LAB_0019540d;
      if ((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) ||
          ((uVar10 == 0x7d || (uVar10 == 0x5d)))) && ((bVar8 == 0x30 || (bVar9 == 0x30)))) {
        basic_substring(&local_30,s_,uVar5);
        s_ = local_30.str;
        uVar7 = local_30.len;
        goto LAB_001954ca;
      }
    }
    else if ((bVar1 & 0xdf) == 0x50) {
      bVar11 = false;
      uVar5 = len_;
LAB_0019540d:
      if ((s_[uVar5] & 0xdfU) != 0x50) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          pcVar2 = (code *)swi(3);
          bVar12 = (basic_substring<const_char>)(*pcVar2)();
          return bVar12;
        }
        handle_error(0x1fce74,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1a0f,"str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
      }
      uVar6 = uVar5 + 2;
      if (((uVar6 < uVar7) && ((s_[uVar5 + 1] == '+' || (s_[uVar5 + 1] == '-')))) &&
         (!(bool)(bVar8 != 0x30 & (bVar11 ^ 1U)))) {
        bVar8 = s_[uVar6];
        bVar1 = bVar8 - 0x30;
        if (bVar1 < 10) {
          do {
            if ((3 - uVar7) + uVar6 == 2) goto LAB_001954ca;
            bVar8 = s_[uVar6 + 1];
            uVar6 = uVar6 + 1;
          } while ((byte)(bVar8 - 0x30) < 10);
        }
        if ((bVar1 < 10) &&
           ((((bVar8 < 0x3c && ((0x800120100002601U >> ((ulong)bVar8 & 0x3f) & 1) != 0)) ||
             (bVar8 == 0x5d)) || (bVar8 == 0x7d)))) {
          basic_substring(&local_30,s_,uVar6);
          s_ = local_30.str;
          uVar7 = local_30.len;
          goto LAB_001954ca;
        }
      }
    }
    else if (((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
              (bVar1 == 0x7d)) || (bVar1 == 0x5d)) && (bVar8 == 0x30)) {
      basic_substring(&local_30,s_,len_);
      s_ = local_30.str;
      uVar7 = local_30.len;
      goto LAB_001954ca;
    }
  }
  else {
LAB_001954c5:
    s_ = this->str;
  }
  uVar7 = 0;
LAB_001954ca:
  bVar12.len = uVar7;
  bVar12.str = s_;
  return bVar12;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_oct(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '7')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_oct;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_oct;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_oct:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '7')
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_oct;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_oct:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }